

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::LineRenderTestCase::testRender(LineRenderTestCase *this)

{
  int *value;
  int *value_00;
  int *value_01;
  ostringstream *poVar1;
  ostringstream *this_00;
  TestLog *log;
  pointer pCVar2;
  Context *pCVar3;
  Surface *pSVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  RenderTarget *pRVar8;
  RenderTarget *pRVar9;
  MessageBuilder *pMVar10;
  Vec4 *extraout_RDX;
  Vec4 *p;
  Vec4 *p_00;
  Vec4 *extraout_RDX_00;
  int contextNdx;
  int samples;
  ulong uVar11;
  long lVar12;
  string fromProperties;
  Surface *surfaces [2];
  Context *contexts [2];
  Surface refSurface;
  Surface testSurface;
  string toProperties;
  ReferenceContextBuffers buffers;
  MessageBuilder local_6688;
  ReferenceContextLimits local_6508;
  PositionColorShader program;
  GLContext glesContext;
  ReferenceContext refContext;
  
  pRVar8 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  samples = 1;
  if (1 < pRVar8->m_numSamples) {
    samples = pRVar8->m_numSamples;
  }
  log = ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  refContext.super_Context._vptr_Context = (_func_int **)0x0;
  refContext.super_Context.m_type.super_ApiType.m_bits = (ApiType)0xc8;
  refContext.super_Context._12_4_ = 200;
  sglr::GLContext::GLContext
            (&glesContext,((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx,log,0
             ,(IVec4 *)&refContext);
  local_6508.extensionStr._M_dataplus._M_p = (pointer)&local_6508.extensionStr.field_2;
  local_6508.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_6508.maxTextureImageUnits = 0x10;
  local_6508.maxTexture2DSize = 0x800;
  local_6508.maxTextureCubeSize = 0x800;
  local_6508.maxTexture2DArrayLayers = 0x100;
  local_6508.maxTexture3DSize = 0x100;
  local_6508.maxRenderbufferSize = 0x800;
  local_6508.maxVertexAttribs = 0x10;
  local_6508.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6508.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6508.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6508.extensionStr._M_string_length = 0;
  local_6508.extensionStr.field_2._M_local_buf[0] = '\0';
  pRVar8 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  pRVar9 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&buffers,&pRVar8->m_pixelFormat,pRVar9->m_depthBits,0,200,200,samples);
  sglr::ReferenceContextBuffers::getColorbuffer
            ((MultisamplePixelBufferAccess *)&local_6688,&buffers);
  sglr::ReferenceContextBuffers::getDepthbuffer((MultisamplePixelBufferAccess *)&program,&buffers);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)&fromProperties,&buffers);
  sglr::ReferenceContext::ReferenceContext
            (&refContext,&local_6508,(MultisamplePixelBufferAccess *)&local_6688,
             (MultisamplePixelBufferAccess *)&program,
             (MultisamplePixelBufferAccess *)&fromProperties);
  PositionColorShader::PositionColorShader(&program);
  tcu::Surface::Surface(&testSurface,200,200);
  tcu::Surface::Surface(&refSurface,200,200);
  poVar1 = &local_6688.m_str;
  surfaces[0] = &testSurface;
  surfaces[1] = &refSurface;
  contexts[0] = &glesContext.super_Context;
  contexts[1] = &refContext.super_Context;
  local_6688.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Viewport: left=");
  pMVar10 = tcu::MessageBuilder::operator<<(&local_6688,&(this->m_viewport).left);
  std::operator<<((ostream *)&pMVar10->m_str,"\tbottom=");
  value = &(this->m_viewport).bottom;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value);
  std::operator<<((ostream *)&pMVar10->m_str,"\twidth=");
  value_00 = &(this->m_viewport).width;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value_00);
  std::operator<<((ostream *)&pMVar10->m_str,"\theight=");
  value_01 = &(this->m_viewport).height;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value_01);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_6688.m_str;
  local_6688.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Rendering lines with line width ");
  pMVar10 = tcu::MessageBuilder::operator<<(&local_6688,&this->m_lineWidth);
  std::operator<<((ostream *)&pMVar10->m_str,". Coordinates:");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_6688.m_str;
  this_00 = &local_6688.m_str;
  lVar12 = 0;
  p = extraout_RDX;
  for (uVar11 = 0;
      pCVar2 = (this->m_lines).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(this->m_lines).
                             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 6);
      uVar11 = uVar11 + 1) {
    (anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              (&fromProperties,(_anonymous_namespace_ *)((long)(pCVar2->p0).m_data + lVar12),p);
    (anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              (&toProperties,
               (_anonymous_namespace_ *)
               ((long)(((this->m_lines).
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                        ._M_impl.super__Vector_impl_data._M_start)->p1).m_data + lVar12),p_00);
    local_6688.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"\tfrom (x=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)(((this->m_lines).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                lVar12));
    std::operator<<((ostream *)poVar1,"\ty=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)(((this->m_lines).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                lVar12 + 4));
    std::operator<<((ostream *)poVar1,"\tz=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)(((this->m_lines).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                lVar12 + 8));
    std::operator<<((ostream *)poVar1,"\tw=");
    std::ostream::operator<<
              (poVar1,*(float *)((long)(((this->m_lines).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                lVar12 + 0xc));
    std::operator<<((ostream *)poVar1,")\t");
    std::operator<<((ostream *)poVar1,(string *)&fromProperties);
    tcu::MessageBuilder::operator<<(&local_6688,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    local_6688.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"\tto   (x=");
    std::ostream::operator<<
              (this_00,*(float *)((long)(((this->m_lines).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                 lVar12));
    std::operator<<((ostream *)this_00,"\ty=");
    std::ostream::operator<<
              (this_00,*(float *)((long)(((this->m_lines).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                 lVar12 + 4));
    std::operator<<((ostream *)this_00,"\tz=");
    std::ostream::operator<<
              (this_00,*(float *)((long)(((this->m_lines).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                 lVar12 + 8));
    std::operator<<((ostream *)this_00,"\tw=");
    std::ostream::operator<<
              (this_00,*(float *)((long)(((this->m_lines).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                 lVar12 + 0xc));
    std::operator<<((ostream *)this_00,")\t");
    std::operator<<((ostream *)this_00,(string *)&toProperties);
    tcu::MessageBuilder::operator<<(&local_6688,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    local_6688.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6688.m_str);
    tcu::MessageBuilder::operator<<(&local_6688,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6688.m_str);
    std::__cxx11::string::~string((string *)&toProperties);
    std::__cxx11::string::~string((string *)&fromProperties);
    lVar12 = lVar12 + 0x40;
    p = extraout_RDX_00;
  }
  for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
    pCVar3 = contexts[lVar12];
    pSVar4 = surfaces[lVar12];
    uVar5 = (*pCVar3->_vptr_Context[0x75])(pCVar3,&program);
    uVar6 = (*pCVar3->_vptr_Context[0x59])(pCVar3,(ulong)uVar5,"a_position");
    uVar7 = (*pCVar3->_vptr_Context[0x59])(pCVar3,(ulong)uVar5,"a_color");
    (*pCVar3->_vptr_Context[0x2a])(0,0,0,0x3f800000,pCVar3);
    (*pCVar3->_vptr_Context[0x2b])(0x3f800000,pCVar3);
    (*pCVar3->_vptr_Context[0x2d])(pCVar3,0x4100);
    (*pCVar3->_vptr_Context[5])
              (pCVar3,(ulong)(uint)(this->m_viewport).left,(ulong)(uint)*value,
               (ulong)(uint)*value_00,(ulong)(uint)*value_01);
    (*pCVar3->_vptr_Context[0x76])(pCVar3,(ulong)uVar5);
    (*pCVar3->_vptr_Context[0x50])(pCVar3,(ulong)uVar6);
    (*pCVar3->_vptr_Context[0x50])(pCVar3,(ulong)uVar7);
    (*pCVar3->_vptr_Context[0x4e])
              (pCVar3,(ulong)uVar6,4,0x1406,0,0x20,
               (this->m_lines).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
               ._M_impl.super__Vector_impl_data._M_start);
    (*pCVar3->_vptr_Context[0x4e])
              (pCVar3,(ulong)uVar7,4,0x1406,0,0x20,
               &((this->m_lines).
                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->c0);
    (*pCVar3->_vptr_Context[0x67])(this->m_lineWidth,pCVar3);
    (*pCVar3->_vptr_Context[0x68])
              (pCVar3,1,0,
               (ulong)((uint)((ulong)((long)(this->m_lines).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_lines).
                                           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5) &
                      0xfffffffe));
    (*pCVar3->_vptr_Context[0x51])(pCVar3,(ulong)uVar6);
    (*pCVar3->_vptr_Context[0x51])(pCVar3,(ulong)uVar7);
    (*pCVar3->_vptr_Context[0x76])(pCVar3,0);
    (*pCVar3->_vptr_Context[0x77])(pCVar3,(ulong)uVar5);
    (*pCVar3->_vptr_Context[0x7a])(pCVar3);
    (*pCVar3->_vptr_Context[0x80])(pCVar3,pSVar4,0,0,200,200);
  }
  tcu::Surface::getAccess((PixelBufferAccess *)&local_6688,&testSurface);
  tcu::Surface::getAccess((PixelBufferAccess *)&fromProperties,&refSurface);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&local_6688,&fromProperties);
  tcu::Surface::~Surface(&refSurface);
  tcu::Surface::~Surface(&testSurface);
  sglr::ShaderProgram::~ShaderProgram(&program.super_ShaderProgram);
  sglr::ReferenceContext::~ReferenceContext(&refContext);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&buffers);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_6508);
  sglr::GLContext::~GLContext(&glesContext);
  return;
}

Assistant:

void LineRenderTestCase::testRender (void)
{
	using tcu::TestLog;

	const int numSamples			= de::max(m_context.getRenderTarget().getNumSamples(), 1);
	const int verticesPerLine		= 2;

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	PositionColorShader				program;
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	sglr::Context*					contexts[2] = {&glesContext, &refContext};
	tcu::Surface*					surfaces[2] = {&testSurface, &refSurface};

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering lines with line width " << m_lineWidth << ". Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_lines.size(); ++ndx)
	{
		const std::string fromProperties = genClippingPointInfoString(m_lines[ndx].p0);
		const std::string toProperties   = genClippingPointInfoString(m_lines[ndx].p1);

		log << TestLog::Message << "\tfrom (x=" << m_lines[ndx].p0.x() << "\ty=" << m_lines[ndx].p0.y() << "\tz=" << m_lines[ndx].p0.z() << "\tw=" << m_lines[ndx].p0.w() << ")\t" << fromProperties << TestLog::EndMessage;
		log << TestLog::Message << "\tto   (x=" << m_lines[ndx].p1.x() << "\ty=" << m_lines[ndx].p1.y() << "\tz=" << m_lines[ndx].p1.z() << "\tw=" << m_lines[ndx].p1.w() << ")\t" << toProperties   << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;
	}

	// render test image
	for (int contextNdx = 0; contextNdx < 2; ++contextNdx)
	{
		sglr::Context&	ctx				= *contexts[contextNdx];
		tcu::Surface&	dstSurface		= *surfaces[contextNdx];
		const deUint32	programId		= ctx.createProgram(&program);
		const GLint		positionLoc		= ctx.getAttribLocation(programId, "a_position");
		const GLint		colorLoc		= ctx.getAttribLocation(programId, "a_color");

		ctx.clearColor					(0, 0, 0, 1);
		ctx.clearDepthf					(1.0f);
		ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
		ctx.useProgram					(programId);
		ctx.enableVertexAttribArray		(positionLoc);
		ctx.enableVertexAttribArray		(colorLoc);
		ctx.vertexAttribPointer			(positionLoc,	4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_lines[0].p0);
		ctx.vertexAttribPointer			(colorLoc,		4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_lines[0].c0);
		ctx.lineWidth					(m_lineWidth);
		ctx.drawArrays					(GL_LINES, 0, verticesPerLine * (glw::GLsizei)m_lines.size());
		ctx.disableVertexAttribArray	(positionLoc);
		ctx.disableVertexAttribArray	(colorLoc);
		ctx.useProgram					(0);
		ctx.deleteProgram				(programId);
		ctx.finish						();

		ctx.readPixels(dstSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	}

	// compare
	verifyImage(testSurface.getAccess(), refSurface.getAccess());
}